

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O2

void __thiscall
Highs::formIllConditioningLp1
          (Highs *this,HighsLp *ill_conditioning_lp,vector<int,_std::allocator<int>_> *basic_var,
          bool constraint,double ill_conditioning_bound)

{
  vector<double,_std::allocator<double>_> *this_00;
  uint uVar1;
  vector<int,_std::allocator<int>_> *pvVar2;
  vector<double,_std::allocator<double>_> *this_01;
  vector<double,_std::allocator<double>_> *this_02;
  ulong uVar3;
  undefined7 in_register_00000009;
  pointer piVar4;
  HighsInt iRow;
  int iVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  HighsLp *pHVar9;
  int iVar10;
  long lVar11;
  HighsInt iRow_1;
  long lVar12;
  HighsInt c6_offset;
  HighsInt c5_offset;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  int local_e0;
  uint local_dc;
  vector<int,_std::allocator<int>_> *local_d8;
  vector<int,_std::allocator<int>_> *local_d0;
  int local_c4;
  HighsLp *local_c0;
  vector<double,_std::allocator<double>_> *local_b8;
  vector<double,_std::allocator<double>_> *local_b0;
  vector<double,_std::allocator<double>_> *local_a8;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_a0;
  int local_94;
  string local_90;
  ulong local_70;
  int local_64;
  vector<int,_std::allocator<int>_> *local_60;
  vector<double,_std::allocator<double>_> *local_58;
  ulong local_50;
  HighsSparseMatrix *local_48;
  vector<double,_std::allocator<double>_> *local_40;
  double local_38;
  
  local_e0 = (int)CONCAT71(in_register_00000009,constraint);
  uVar1 = (this->model_).lp_.num_row_;
  local_c4 = uVar1 * 3;
  local_94 = uVar1 * 3 + 1;
  local_58 = &ill_conditioning_lp->row_lower_;
  local_c0 = ill_conditioning_lp;
  local_64 = local_c4;
  local_60 = basic_var;
  local_38 = ill_conditioning_bound;
  for (iVar5 = 0; iVar5 < local_c4; iVar5 = iVar5 + 1) {
    local_100._M_dataplus._M_p = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (local_58,(double *)&local_100);
    local_100._M_dataplus._M_p = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (&ill_conditioning_lp->row_upper_,(double *)&local_100);
  }
  local_50 = (ulong)(uVar1 * 2);
  local_70 = (ulong)uVar1;
  HighsSparseMatrix::ensureColwise(&(this->model_).lp_.a_matrix_);
  local_48 = &local_c0->a_matrix_;
  local_c0->num_col_ = 0;
  local_a0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &local_c0->col_names_;
  local_a8 = &local_c0->col_cost_;
  local_b0 = &local_c0->col_lower_;
  local_b8 = &local_c0->col_upper_;
  local_d8 = &(local_c0->a_matrix_).index_;
  this_00 = &(local_c0->a_matrix_).value_;
  local_d0 = &(local_c0->a_matrix_).start_;
  local_dc = 0;
  pHVar9 = local_c0;
  local_40 = &ill_conditioning_lp->row_upper_;
  while( true ) {
    if ((this->model_).lp_.num_col_ <= (int)local_dc) break;
    if ((this->basis_).col_status.
        super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
        super__Vector_impl_data._M_start[(int)local_dc] == kBasic) {
      std::vector<int,_std::allocator<int>_>::push_back(local_60,(value_type_conflict2 *)&local_dc);
      std::__cxx11::to_string(&local_90,pHVar9->num_col_);
      std::operator+(&local_100,"y_",&local_90);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_a0,&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_90);
      local_100._M_dataplus._M_p = (pointer)0x0;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                (local_a8,(double *)&local_100);
      local_100._M_dataplus._M_p = &DAT_fff0000000000000;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                (local_b0,(double *)&local_100);
      std::vector<double,_std::allocator<double>_>::push_back
                (local_b8,(value_type_conflict1 *)&kHighsInf);
      uVar3 = (ulong)(int)local_dc;
      piVar4 = (this->model_).lp_.a_matrix_.start_.super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar7 = (long)piVar4[uVar3];
      lVar11 = lVar7 * 4;
      lVar12 = lVar7 * 8;
      for (; pHVar9 = local_c0, pvVar2 = local_d8, lVar7 < piVar4[(long)(int)uVar3 + 1];
          lVar7 = lVar7 + 1) {
        std::vector<int,_std::allocator<int>_>::push_back
                  (local_d8,(value_type_conflict2 *)
                            ((long)(this->model_).lp_.a_matrix_.index_.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar11));
        std::vector<double,_std::allocator<double>_>::push_back
                  (this_00,(value_type_conflict1 *)
                           ((long)(this->model_).lp_.a_matrix_.value_.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start + lVar12));
        uVar3 = (ulong)local_dc;
        piVar4 = (this->model_).lp_.a_matrix_.start_.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar11 = lVar11 + 4;
        lVar12 = lVar12 + 8;
      }
      if ((char)local_e0 == '\0') {
        local_100._M_dataplus._M_p._0_4_ = local_c0->num_col_ + (int)local_70;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_d8,(int *)&local_100);
        local_100._M_dataplus._M_p = (pointer)0x3ff0000000000000;
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  (this_00,(double *)&local_100);
        std::vector<int,_std::allocator<int>_>::push_back(pvVar2,&local_c4);
        local_100._M_dataplus._M_p = (pointer)0x3ff0000000000000;
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  (this_00,(double *)&local_100);
      }
      local_100._M_dataplus._M_p._0_4_ =
           (int)((ulong)((long)(pHVar9->a_matrix_).index_.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(pHVar9->a_matrix_).index_.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_d0,(int *)&local_100);
      pHVar9->num_col_ = pHVar9->num_col_ + 1;
    }
    local_dc = local_dc + 1;
  }
  uVar3 = local_70;
  for (local_dc = 0; iVar5 = (int)uVar3, (int)local_dc < iVar5; local_dc = local_dc + 1) {
    if ((this->basis_).row_status.
        super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
        super__Vector_impl_data._M_start[(int)local_dc] == kBasic) {
      local_100._M_dataplus._M_p._0_4_ = local_dc + (this->model_).lp_.num_col_;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_60,(int *)&local_100);
      std::__cxx11::to_string(&local_90,pHVar9->num_col_);
      std::operator+(&local_100,"y_",&local_90);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_a0,&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_90);
      local_100._M_dataplus._M_p = (pointer)0x0;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                (local_a8,(double *)&local_100);
      local_100._M_dataplus._M_p = &DAT_fff0000000000000;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                (local_b0,(double *)&local_100);
      std::vector<double,_std::allocator<double>_>::push_back
                (local_b8,(value_type_conflict1 *)&kHighsInf);
      std::vector<int,_std::allocator<int>_>::push_back(local_d8,(value_type_conflict2 *)&local_dc);
      local_100._M_dataplus._M_p = (pointer)0xbff0000000000000;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                (this_00,(double *)&local_100);
      pvVar2 = local_d8;
      if ((char)local_e0 == '\0') {
        local_100._M_dataplus._M_p._0_4_ = pHVar9->num_col_ + iVar5;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_d8,(int *)&local_100);
        local_100._M_dataplus._M_p = (pointer)0x3ff0000000000000;
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  (this_00,(double *)&local_100);
        std::vector<int,_std::allocator<int>_>::push_back(pvVar2,&local_c4);
        uVar3 = local_70;
        local_100._M_dataplus._M_p = (pointer)0x3ff0000000000000;
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  (this_00,(double *)&local_100);
      }
      local_100._M_dataplus._M_p._0_4_ =
           (int)((ulong)((long)(pHVar9->a_matrix_).index_.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(pHVar9->a_matrix_).index_.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_d0,(int *)&local_100);
      pHVar9->num_col_ = pHVar9->num_col_ + 1;
    }
  }
  if ((char)local_e0 == '\0') {
    local_e0 = 0;
    if (0 < iVar5) {
      local_e0 = iVar5;
    }
  }
  else {
    for (local_90._M_dataplus._M_p._0_4_ = 0; (int)local_90._M_dataplus._M_p < iVar5;
        local_90._M_dataplus._M_p._0_4_ = (int)local_90._M_dataplus._M_p + 1) {
      std::vector<int,_std::allocator<int>_>::push_back(local_d8,(value_type_conflict2 *)&local_90);
      local_100._M_dataplus._M_p = (pointer)0x3ff0000000000000;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                (this_00,(double *)&local_100);
      local_100._M_dataplus._M_p._0_4_ =
           (int)((ulong)((long)(pHVar9->a_matrix_).index_.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(pHVar9->a_matrix_).index_.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_d0,(int *)&local_100);
    }
    uVar8 = 0;
    if (0 < iVar5) {
      uVar8 = uVar3 & 0xffffffff;
    }
    local_e0 = (int)uVar8;
    while (pHVar9 = local_c0, iVar6 = (int)uVar8, uVar8 = (ulong)(iVar6 - 1), iVar6 != 0) {
      local_100._M_dataplus._M_p._0_4_ =
           (int)((ulong)((long)(local_c0->a_matrix_).index_.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(local_c0->a_matrix_).index_.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_d0,(int *)&local_100);
    }
    for (local_90._M_dataplus._M_p._0_4_ = 0; (int)local_90._M_dataplus._M_p < iVar5;
        local_90._M_dataplus._M_p._0_4_ = (int)local_90._M_dataplus._M_p + 1) {
      std::vector<int,_std::allocator<int>_>::push_back(local_d8,(value_type_conflict2 *)&local_90);
      local_100._M_dataplus._M_p = (pointer)0x3ff0000000000000;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                (this_00,(double *)&local_100);
    }
    local_100._M_dataplus._M_p._0_4_ =
         (int)((ulong)((long)(pHVar9->a_matrix_).index_.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(pHVar9->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 2);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_d0,(int *)&local_100);
    (pHVar9->a_matrix_).num_col_ = local_c4 + 1;
    (pHVar9->a_matrix_).num_row_ = iVar5;
    HighsSparseMatrix::ensureRowwise(local_48);
    (pHVar9->a_matrix_).format_ = kColwise;
    (pHVar9->a_matrix_).num_col_ = iVar5;
    (pHVar9->a_matrix_).num_row_ = local_c4 + 1;
  }
  pHVar9->num_row_ = local_64 + 2;
  for (iVar5 = 0; local_e0 != iVar5; iVar5 = iVar5 + 1) {
    std::__cxx11::to_string(&local_90,iVar5);
    std::operator+(&local_100,"u_",&local_90);
    uVar3 = local_70;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(local_a0,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_90);
    local_100._M_dataplus._M_p = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (local_a8,(double *)&local_100);
    local_100._M_dataplus._M_p = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (local_b0,(double *)&local_100);
    std::vector<double,_std::allocator<double>_>::push_back
              (local_b8,(value_type_conflict1 *)&kHighsInf);
    pvVar2 = local_d8;
    iVar10 = (int)uVar3 + iVar5;
    local_100._M_dataplus._M_p._0_4_ = iVar10;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_d8,(int *)&local_100);
    local_100._M_dataplus._M_p = (pointer)0xbff0000000000000;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(this_00,(double *)&local_100)
    ;
    iVar6 = (int)local_50 + iVar5;
    local_100._M_dataplus._M_p._0_4_ = iVar6;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,(int *)&local_100);
    local_100._M_dataplus._M_p = (pointer)0x3ff0000000000000;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(this_00,(double *)&local_100)
    ;
    pHVar9 = local_c0;
    local_100._M_dataplus._M_p._0_4_ =
         (int)((ulong)((long)(local_c0->a_matrix_).index_.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(local_c0->a_matrix_).index_.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 2);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_d0,(int *)&local_100);
    pHVar9->num_col_ = pHVar9->num_col_ + 1;
    std::__cxx11::to_string(&local_90,iVar5);
    std::operator+(&local_100,"w_",&local_90);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(local_a0,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_90);
    local_100._M_dataplus._M_p = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (local_a8,(double *)&local_100);
    local_100._M_dataplus._M_p = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (local_b0,(double *)&local_100);
    std::vector<double,_std::allocator<double>_>::push_back
              (local_b8,(value_type_conflict1 *)&kHighsInf);
    pvVar2 = local_d8;
    local_100._M_dataplus._M_p._0_4_ = iVar10;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_d8,(int *)&local_100);
    local_100._M_dataplus._M_p = (pointer)0x3ff0000000000000;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(this_00,(double *)&local_100)
    ;
    local_100._M_dataplus._M_p._0_4_ = iVar6;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,(int *)&local_100);
    local_100._M_dataplus._M_p = (pointer)0x3ff0000000000000;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(this_00,(double *)&local_100)
    ;
    pHVar9 = local_c0;
    local_100._M_dataplus._M_p._0_4_ =
         (int)((ulong)((long)(local_c0->a_matrix_).index_.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(local_c0->a_matrix_).index_.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 2);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_d0,(int *)&local_100);
    pHVar9->num_col_ = pHVar9->num_col_ + 1;
  }
  for (iVar5 = 0; this_01 = local_58, local_e0 != iVar5; iVar5 = iVar5 + 1) {
    std::__cxx11::to_string(&local_90,iVar5);
    std::operator+(&local_100,"s_",&local_90);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(local_a0,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_90);
    local_100._M_dataplus._M_p = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (local_a8,(double *)&local_100);
    local_100._M_dataplus._M_p = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (local_b0,(double *)&local_100);
    std::vector<double,_std::allocator<double>_>::push_back
              (local_b8,(value_type_conflict1 *)&kHighsInf);
    pvVar2 = local_d8;
    local_100._M_dataplus._M_p._0_4_ = iVar5;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_d8,(int *)&local_100);
    local_100._M_dataplus._M_p = (pointer)0xbff0000000000000;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(this_00,(double *)&local_100)
    ;
    std::vector<int,_std::allocator<int>_>::push_back(pvVar2,&local_94);
    local_100._M_dataplus._M_p = (pointer)0x3ff0000000000000;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(this_00,(double *)&local_100)
    ;
    local_100._M_dataplus._M_p._0_4_ =
         (int)((ulong)((long)(pHVar9->a_matrix_).index_.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(pHVar9->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 2);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_d0,(int *)&local_100);
    pHVar9->num_col_ = pHVar9->num_col_ + 1;
    std::__cxx11::to_string(&local_90,iVar5);
    std::operator+(&local_100,"t_",&local_90);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(local_a0,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_90);
    local_100._M_dataplus._M_p = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (local_a8,(double *)&local_100);
    local_100._M_dataplus._M_p = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (local_b0,(double *)&local_100);
    std::vector<double,_std::allocator<double>_>::push_back
              (local_b8,(value_type_conflict1 *)&kHighsInf);
    pvVar2 = local_d8;
    local_100._M_dataplus._M_p._0_4_ = iVar5;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_d8,(int *)&local_100);
    local_100._M_dataplus._M_p = (pointer)0x3ff0000000000000;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(this_00,(double *)&local_100)
    ;
    std::vector<int,_std::allocator<int>_>::push_back(pvVar2,&local_94);
    local_100._M_dataplus._M_p = (pointer)0x3ff0000000000000;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(this_00,(double *)&local_100)
    ;
    local_100._M_dataplus._M_p._0_4_ =
         (int)((ulong)((long)(pHVar9->a_matrix_).index_.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(pHVar9->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 2);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_d0,(int *)&local_100);
    pHVar9->num_col_ = pHVar9->num_col_ + 1;
  }
  local_100._M_dataplus._M_p = (pointer)0x3ff0000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(local_58,(double *)&local_100);
  this_02 = local_40;
  local_100._M_dataplus._M_p = (pointer)0x3ff0000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(local_40,(double *)&local_100);
  local_100._M_dataplus._M_p = &DAT_fff0000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(this_01,(double *)&local_100);
  std::vector<double,_std::allocator<double>_>::push_back(this_02,&local_38);
  for (iVar5 = 0; local_e0 != iVar5; iVar5 = iVar5 + 1) {
    std::__cxx11::to_string(&local_90,iVar5);
    std::operator+(&local_100,"IfsPlus_",&local_90);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(local_a0,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_90);
    local_100._M_dataplus._M_p = (pointer)0x3ff0000000000000;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (local_a8,(double *)&local_100);
    local_100._M_dataplus._M_p = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (local_b0,(double *)&local_100);
    std::vector<double,_std::allocator<double>_>::push_back
              (local_b8,(value_type_conflict1 *)&kHighsInf);
    iVar6 = (int)local_50 + iVar5;
    local_100._M_dataplus._M_p._0_4_ = iVar6;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_d8,(int *)&local_100);
    local_100._M_dataplus._M_p = (pointer)0xbff0000000000000;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(this_00,(double *)&local_100)
    ;
    pHVar9 = local_c0;
    local_100._M_dataplus._M_p._0_4_ =
         (int)((ulong)((long)(local_c0->a_matrix_).index_.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(local_c0->a_matrix_).index_.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 2);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_d0,(int *)&local_100);
    pHVar9->num_col_ = pHVar9->num_col_ + 1;
    std::__cxx11::to_string(&local_90,iVar5);
    std::operator+(&local_100,"IfsMinus_",&local_90);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(local_a0,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_90);
    local_100._M_dataplus._M_p = (pointer)0x3ff0000000000000;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (local_a8,(double *)&local_100);
    local_100._M_dataplus._M_p = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (local_b0,(double *)&local_100);
    std::vector<double,_std::allocator<double>_>::push_back
              (local_b8,(value_type_conflict1 *)&kHighsInf);
    local_100._M_dataplus._M_p._0_4_ = iVar6;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_d8,(int *)&local_100);
    local_100._M_dataplus._M_p = (pointer)0x3ff0000000000000;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(this_00,(double *)&local_100)
    ;
    pHVar9 = local_c0;
    local_100._M_dataplus._M_p._0_4_ =
         (int)((ulong)((long)(local_c0->a_matrix_).index_.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(local_c0->a_matrix_).index_.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 2);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_d0,(int *)&local_100);
    pHVar9->num_col_ = pHVar9->num_col_ + 1;
  }
  (pHVar9->a_matrix_).num_col_ = pHVar9->num_col_;
  (pHVar9->a_matrix_).num_row_ = pHVar9->num_row_;
  return;
}

Assistant:

void Highs::formIllConditioningLp1(HighsLp& ill_conditioning_lp,
                                   std::vector<HighsInt>& basic_var,
                                   const bool constraint,
                                   const double ill_conditioning_bound) {
  HighsLp& incumbent_lp = this->model_.lp_;
  const HighsInt incumbent_num_row = incumbent_lp.num_row_;
  //
  // Using notation from Klotz14
  //
  // For constraint view, conditioning LP minimizes the
  // infeasibilities of c7
  //
  // c4: B^Ty         -   s +   t   = 0
  // c1:    y - u + w               = 0
  // c7:        u + w               = 0
  // c6: e^Ty                       = 1
  // c5:               e^Ts + e^Tt <= eps
  // y free; u, w, s, t >= 0
  //
  // Column view uses B rather than B^T
  //
  // Set up offsets
  //
  const HighsInt c4_offset = 0;
  const HighsInt c1_offset = incumbent_num_row;
  const HighsInt c7_offset = 2 * incumbent_num_row;
  const HighsInt c6_offset = 3 * incumbent_num_row;
  const HighsInt c5_offset = 3 * incumbent_num_row + 1;
  for (HighsInt iRow = 0; iRow < c6_offset; iRow++) {
    ill_conditioning_lp.row_lower_.push_back(0);
    ill_conditioning_lp.row_upper_.push_back(0);
  }
  HighsSparseMatrix& incumbent_matrix = incumbent_lp.a_matrix_;
  incumbent_matrix.ensureColwise();
  HighsSparseMatrix& ill_conditioning_matrix = ill_conditioning_lp.a_matrix_;
  // Form the basis matrix and
  //
  // * For constraint view, add the identity matrix and vector of
  // * ones, and transpose the resulting matrix
  //
  // * For column view, add an identity matrix column and unit entry
  // * below each column
  //
  ill_conditioning_lp.num_col_ = 0;
  for (HighsInt iCol = 0; iCol < incumbent_lp.num_col_; iCol++) {
    if (this->basis_.col_status[iCol] != HighsBasisStatus::kBasic) continue;
    // Basic column goes into ill-conditioning LP, possibly with
    // identity matrix column for constraint y - u + w = 0 and unit
    // entry for e^Ty = 1
    basic_var.push_back(iCol);
    ill_conditioning_lp.col_names_.push_back(
        "y_" + std::to_string(ill_conditioning_lp.num_col_));
    ill_conditioning_lp.col_cost_.push_back(0);
    ill_conditioning_lp.col_lower_.push_back(-kHighsInf);
    ill_conditioning_lp.col_upper_.push_back(kHighsInf);
    for (HighsInt iEl = incumbent_matrix.start_[iCol];
         iEl < incumbent_matrix.start_[iCol + 1]; iEl++) {
      ill_conditioning_matrix.index_.push_back(incumbent_matrix.index_[iEl]);
      ill_conditioning_matrix.value_.push_back(incumbent_matrix.value_[iEl]);
    }
    if (!constraint) {
      // Add identity matrix column for constraint y - u + w = 0
      ill_conditioning_matrix.index_.push_back(c1_offset +
                                               ill_conditioning_lp.num_col_);
      ill_conditioning_matrix.value_.push_back(1.0);
      // Add unit entry for e^Ty = 1
      ill_conditioning_matrix.index_.push_back(c6_offset);
      ill_conditioning_matrix.value_.push_back(1.0);
    }
    ill_conditioning_matrix.start_.push_back(
        HighsInt(ill_conditioning_matrix.index_.size()));
    ill_conditioning_lp.num_col_++;
  }

  for (HighsInt iRow = 0; iRow < incumbent_num_row; iRow++) {
    if (this->basis_.row_status[iRow] != HighsBasisStatus::kBasic) continue;
    // Basic slack goes into conditioning LP
    basic_var.push_back(incumbent_lp.num_col_ + iRow);
    ill_conditioning_lp.col_names_.push_back(
        "y_" + std::to_string(ill_conditioning_lp.num_col_));
    ill_conditioning_lp.col_cost_.push_back(0);
    ill_conditioning_lp.col_lower_.push_back(-kHighsInf);
    ill_conditioning_lp.col_upper_.push_back(kHighsInf);
    ill_conditioning_matrix.index_.push_back(iRow);
    ill_conditioning_matrix.value_.push_back(-1.0);
    if (!constraint) {
      // Add identity matrix column for constraint y - u + w = 0
      ill_conditioning_matrix.index_.push_back(c1_offset +
                                               ill_conditioning_lp.num_col_);
      ill_conditioning_matrix.value_.push_back(1.0);
      // Add unit entry for e^Ty = 1
      ill_conditioning_matrix.index_.push_back(c6_offset);
      ill_conditioning_matrix.value_.push_back(1.0);
    }
    ill_conditioning_matrix.start_.push_back(
        HighsInt(ill_conditioning_matrix.index_.size()));
    ill_conditioning_lp.num_col_++;
  }
  assert(ill_conditioning_lp.num_col_ == incumbent_num_row);
  if (constraint) {
    // Add the identity matrix for constraint y - u + w = 0
    for (HighsInt iRow = 0; iRow < incumbent_num_row; iRow++) {
      ill_conditioning_matrix.index_.push_back(iRow);
      ill_conditioning_matrix.value_.push_back(1.0);
      ill_conditioning_matrix.start_.push_back(
          HighsInt(ill_conditioning_matrix.index_.size()));
    }
    // Add the square zero matrix of c7
    for (HighsInt iRow = 0; iRow < incumbent_num_row; iRow++)
      ill_conditioning_matrix.start_.push_back(
          HighsInt(ill_conditioning_matrix.index_.size()));
    // Add the vector of ones for e^Ty = 1
    for (HighsInt iRow = 0; iRow < incumbent_num_row; iRow++) {
      ill_conditioning_matrix.index_.push_back(iRow);
      ill_conditioning_matrix.value_.push_back(1.0);
    }
    ill_conditioning_matrix.start_.push_back(
        HighsInt(ill_conditioning_matrix.index_.size()));

    // Transpose the resulting matrix
    ill_conditioning_matrix.num_col_ = c6_offset + 1;
    ill_conditioning_matrix.num_row_ = incumbent_num_row;
    ill_conditioning_matrix.ensureRowwise();
    ill_conditioning_matrix.format_ = MatrixFormat::kColwise;
    ill_conditioning_matrix.num_col_ = incumbent_num_row;
    ill_conditioning_matrix.num_row_ = c6_offset + 1;
  }

  assert(ill_conditioning_lp.num_col_ == incumbent_num_row);
  ill_conditioning_lp.num_row_ = 3 * incumbent_num_row + 2;

  // Now add the variables u and w
  for (HighsInt iRow = 0; iRow < incumbent_num_row; iRow++) {
    // Adding u with cost 0
    ill_conditioning_lp.col_names_.push_back("u_" + std::to_string(iRow));
    ill_conditioning_lp.col_cost_.push_back(0);
    ill_conditioning_lp.col_lower_.push_back(0);
    ill_conditioning_lp.col_upper_.push_back(kHighsInf);
    // Contribution to c1: y - u + w = 0
    ill_conditioning_matrix.index_.push_back(c1_offset + iRow);
    ill_conditioning_matrix.value_.push_back(-1.0);
    // Contribution to c7: u + w = 0
    ill_conditioning_matrix.index_.push_back(c7_offset + iRow);
    ill_conditioning_matrix.value_.push_back(1.0);
    ill_conditioning_matrix.start_.push_back(
        HighsInt(ill_conditioning_matrix.index_.size()));
    ill_conditioning_lp.num_col_++;
    // Adding w with cost 0
    ill_conditioning_lp.col_names_.push_back("w_" + std::to_string(iRow));
    ill_conditioning_lp.col_cost_.push_back(0);
    ill_conditioning_lp.col_lower_.push_back(0);
    ill_conditioning_lp.col_upper_.push_back(kHighsInf);
    // Contribution to c1: y - u + w = 0
    ill_conditioning_matrix.index_.push_back(c1_offset + iRow);
    ill_conditioning_matrix.value_.push_back(1.0);
    // Contribution to c7: u + w = 0
    ill_conditioning_matrix.index_.push_back(c7_offset + iRow);
    ill_conditioning_matrix.value_.push_back(1.0);
    ill_conditioning_matrix.start_.push_back(
        HighsInt(ill_conditioning_matrix.index_.size()));
    ill_conditioning_lp.num_col_++;
  }
  // Now add the variables s and t
  for (HighsInt iRow = 0; iRow < incumbent_num_row; iRow++) {
    // Adding s with cost 0
    ill_conditioning_lp.col_names_.push_back("s_" + std::to_string(iRow));
    ill_conditioning_lp.col_cost_.push_back(0);
    ill_conditioning_lp.col_lower_.push_back(0);
    ill_conditioning_lp.col_upper_.push_back(kHighsInf);
    // Contribution to c4: B^Ty - s + t = 0
    ill_conditioning_matrix.index_.push_back(c4_offset + iRow);
    ill_conditioning_matrix.value_.push_back(-1.0);
    // Contribution to c5: e^Ts + e^Tt <= eps
    ill_conditioning_matrix.index_.push_back(c5_offset);
    ill_conditioning_matrix.value_.push_back(1.0);
    ill_conditioning_matrix.start_.push_back(
        HighsInt(ill_conditioning_matrix.index_.size()));
    ill_conditioning_lp.num_col_++;
    // Adding t with cost 0
    ill_conditioning_lp.col_names_.push_back("t_" + std::to_string(iRow));
    ill_conditioning_lp.col_cost_.push_back(0);
    ill_conditioning_lp.col_lower_.push_back(0);
    ill_conditioning_lp.col_upper_.push_back(kHighsInf);
    // Contribution to c4: B^Ty - s + t = 0
    ill_conditioning_matrix.index_.push_back(c4_offset + iRow);
    ill_conditioning_matrix.value_.push_back(1.0);
    // Contribution to c5: e^Ts + e^Tt <= eps
    ill_conditioning_matrix.index_.push_back(c5_offset);
    ill_conditioning_matrix.value_.push_back(1.0);
    ill_conditioning_matrix.start_.push_back(
        HighsInt(ill_conditioning_matrix.index_.size()));
    ill_conditioning_lp.num_col_++;
  }
  // Add the bounds for c6: e^Ty = 1
  ill_conditioning_lp.row_lower_.push_back(1);
  ill_conditioning_lp.row_upper_.push_back(1);
  // Add the bounds for c5: e^Ts + e^Tt <= eps
  assert(ill_conditioning_bound > 0);
  ill_conditioning_lp.row_lower_.push_back(-kHighsInf);
  ill_conditioning_lp.row_upper_.push_back(ill_conditioning_bound);
  assert(HighsInt(ill_conditioning_lp.row_lower_.size()) ==
         ill_conditioning_lp.num_row_);
  assert(HighsInt(ill_conditioning_lp.row_upper_.size()) ==
         ill_conditioning_lp.num_row_);

  // Now add the variables to measure the infeasibilities in
  //
  // c7: u + w = r^+ - r^-
  for (HighsInt iRow = 0; iRow < incumbent_num_row; iRow++) {
    // Adding r^+ with cost 1
    ill_conditioning_lp.col_names_.push_back("IfsPlus_" + std::to_string(iRow));
    ill_conditioning_lp.col_cost_.push_back(1);
    ill_conditioning_lp.col_lower_.push_back(0);
    ill_conditioning_lp.col_upper_.push_back(kHighsInf);
    ill_conditioning_matrix.index_.push_back(c7_offset + iRow);
    ill_conditioning_matrix.value_.push_back(-1.0);
    ill_conditioning_matrix.start_.push_back(
        HighsInt(ill_conditioning_matrix.index_.size()));
    ill_conditioning_lp.num_col_++;
    // Adding r^- with cost 1
    ill_conditioning_lp.col_names_.push_back("IfsMinus_" +
                                             std::to_string(iRow));
    ill_conditioning_lp.col_cost_.push_back(1);
    ill_conditioning_lp.col_lower_.push_back(0);
    ill_conditioning_lp.col_upper_.push_back(kHighsInf);
    ill_conditioning_matrix.index_.push_back(c7_offset + iRow);
    ill_conditioning_matrix.value_.push_back(1.0);
    ill_conditioning_matrix.start_.push_back(
        HighsInt(ill_conditioning_matrix.index_.size()));
    ill_conditioning_lp.num_col_++;
  }
  assert(ill_conditioning_lp.num_col_ == 7 * incumbent_num_row);
  assert(ill_conditioning_lp.num_row_ == 3 * incumbent_num_row + 2);
  ill_conditioning_matrix.num_col_ = ill_conditioning_lp.num_col_;
  ill_conditioning_matrix.num_row_ = ill_conditioning_lp.num_row_;
}